

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void rename_cb(uv_fs_t *req)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *puVar4;
  uv_fs_t *__s1;
  char *pcVar5;
  char *pcVar6;
  uv_fs_t *puVar7;
  char *unaff_R12;
  uv_fs_t *unaff_R14;
  uv_loop_t **unaff_R15;
  uv_dirent_t dent;
  uv_dirent_t dent_00;
  uv_buf_t uVar8;
  uv_loop_t *puStack_c8;
  uint uStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  uv_fs_t *puStack_a0;
  code *pcStack_98;
  code *pcStack_90;
  uv_loop_t *puStack_88;
  uint uStack_80;
  char *pcStack_78;
  
  if (req == &rename_req) {
    if (rename_req.fs_type != UV_FS_RENAME) goto LAB_0015b956;
    if (rename_req.result == 0) {
      rename_cb_count = rename_cb_count + 1;
      uv_fs_req_cleanup(&rename_req);
      return;
    }
  }
  else {
    rename_cb_cold_1();
LAB_0015b956:
    rename_cb_cold_2();
  }
  rename_cb_cold_3();
  if (req == &open_req1) {
    if (open_req1.fs_type != UV_FS_OPEN) goto LAB_0015ba47;
    iVar2 = (int)open_req1.result;
    if (open_req1.result._4_4_ < 0) goto LAB_0015ba4c;
    open_cb_count = open_cb_count + 1;
    if (open_req1.path == (char *)0x0) goto LAB_0015ba51;
    if (*(long *)(open_req1.path + 3) != 0x32656c69665f74 ||
        *(long *)open_req1.path != 0x6c69665f74736574) goto LAB_0015ba56;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    iov = (uv_buf_t)uv_buf_init(buf,0x20);
    puVar4 = loop;
    iVar1 = uv_fs_read(loop,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    iVar2 = (int)puVar4;
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    open_cb_cold_1();
LAB_0015ba47:
    iVar2 = (int)req;
    open_cb_cold_2();
LAB_0015ba4c:
    open_cb_cold_6();
LAB_0015ba51:
    open_cb_cold_5();
LAB_0015ba56:
    open_cb_cold_3();
  }
  open_cb_cold_4();
  fs_file_sync(iVar2);
  fs_file_sync(iVar2);
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  uVar3 = uv_default_loop();
  iVar2 = uv_loop_close(uVar3);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_file_sync_cold_1();
  unlink("test_file");
  unlink("test_file2");
  puVar4 = (uv_loop_t *)uv_default_loop();
  loop = puVar4;
  iVar2 = uv_fs_open(puVar4,&open_req1,"test_file",0x41,0x180,0);
  iVar1 = (int)puVar4;
  if (iVar2 < 0) {
    fs_file_sync_cold_1();
LAB_0015beb4:
    fs_file_sync_cold_2();
LAB_0015beb9:
    fs_file_sync_cold_3();
LAB_0015bebe:
    fs_file_sync_cold_4();
LAB_0015bec3:
    fs_file_sync_cold_5();
LAB_0015bec8:
    fs_file_sync_cold_6();
LAB_0015becd:
    fs_file_sync_cold_7();
LAB_0015bed2:
    fs_file_sync_cold_8();
LAB_0015bed7:
    fs_file_sync_cold_9();
LAB_0015bedc:
    fs_file_sync_cold_10();
LAB_0015bee1:
    fs_file_sync_cold_11();
LAB_0015bee6:
    fs_file_sync_cold_12();
LAB_0015beeb:
    fs_file_sync_cold_13();
LAB_0015bef0:
    fs_file_sync_cold_14();
LAB_0015bef5:
    fs_file_sync_cold_15();
LAB_0015befa:
    fs_file_sync_cold_16();
LAB_0015beff:
    fs_file_sync_cold_17();
LAB_0015bf04:
    fs_file_sync_cold_18();
LAB_0015bf09:
    fs_file_sync_cold_19();
LAB_0015bf0e:
    fs_file_sync_cold_20();
LAB_0015bf13:
    fs_file_sync_cold_21();
LAB_0015bf18:
    fs_file_sync_cold_22();
LAB_0015bf1d:
    fs_file_sync_cold_23();
LAB_0015bf22:
    fs_file_sync_cold_24();
LAB_0015bf27:
    fs_file_sync_cold_25();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015beb4;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar1 = 0;
    iov = uVar8;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015beb9;
    if (write_req.result < 0) goto LAB_0015bebe;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015bec3;
    if (close_req.result != 0) goto LAB_0015bec8;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",2,0,0);
    if (iVar2 < 0) goto LAB_0015becd;
    if (open_req1.result._4_4_ < 0) goto LAB_0015bed2;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar1 = 0;
    iov = uVar8;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015bed7;
    if (read_req.result < 0) goto LAB_0015bedc;
    iVar1 = 0x2f84e0;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_0015bee1;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_ftruncate(0,&ftruncate_req,(int)open_req1.result,7,0);
    if (iVar2 != 0) goto LAB_0015bee6;
    if (ftruncate_req.result != 0) goto LAB_0015beeb;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015bef0;
    if (close_req.result != 0) goto LAB_0015bef5;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_rename(0,&rename_req,"test_file","test_file2",0);
    if (iVar2 != 0) goto LAB_0015befa;
    if (rename_req.result != 0) goto LAB_0015beff;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0,0,0);
    if (iVar2 < 0) goto LAB_0015bf04;
    if (open_req1.result._4_4_ < 0) goto LAB_0015bf09;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar8 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar1 = 0;
    iov = uVar8;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015bf0e;
    if (read_req.result < 0) goto LAB_0015bf13;
    if (buf._0_8_ != 0x75622d74736574) goto LAB_0015bf18;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015bf1d;
    if (close_req.result != 0) goto LAB_0015bf22;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_unlink(0,&unlink_req,"test_file2",0);
    if (iVar2 != 0) goto LAB_0015bf27;
    if (unlink_req.result == 0) {
      uv_fs_req_cleanup(&unlink_req);
      unlink("test_file");
      unlink("test_file2");
      return;
    }
  }
  fs_file_sync_cold_26();
  fs_file_write_null_buffer(iVar1);
  fs_file_write_null_buffer(iVar1);
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  uVar3 = uv_default_loop();
  iVar2 = uv_loop_close(uVar3);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_file_write_null_buffer_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    fs_file_write_null_buffer_cold_1();
LAB_0015c086:
    fs_file_write_null_buffer_cold_2();
LAB_0015c08b:
    fs_file_write_null_buffer_cold_3();
LAB_0015c090:
    fs_file_write_null_buffer_cold_4();
LAB_0015c095:
    fs_file_write_null_buffer_cold_5();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015c086;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = (uv_buf_t)uv_buf_init(0,0);
    iov = uVar8;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 0) goto LAB_0015c08b;
    if (write_req.result != 0) goto LAB_0015c090;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015c095;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  fs_file_write_null_buffer_cold_6();
  pcStack_78 = "test_file";
  pcStack_90 = (code *)0x15c0b8;
  unlink("test_dir/file1");
  pcStack_90 = (code *)0x15c0c4;
  unlink("test_dir/file2");
  pcVar5 = "test_dir";
  pcStack_90 = (code *)0x15c0d3;
  rmdir("test_dir");
  pcStack_90 = (code *)0x15c0d8;
  __s1 = (uv_fs_t *)uv_default_loop();
  pcStack_90 = (code *)0x15c0fd;
  loop = (uv_loop_t *)__s1;
  iVar2 = uv_fs_mkdir(__s1,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    pcStack_90 = (code *)0x15c113;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_0015c520;
    __s1 = (uv_fs_t *)0x0;
    pcStack_90 = (code *)0x15c143;
    iVar2 = uv_fs_open(0,&open_req1,"test_dir/file1",0x41,0x180,0);
    if (iVar2 < 0) goto LAB_0015c525;
    pcStack_90 = (code *)0x15c157;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_90 = (code *)0x15c16d;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015c52a;
    pcStack_90 = (code *)0x15c181;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_90 = (code *)0x15c1a4;
    iVar2 = uv_fs_open(0,&open_req1,"test_dir/file2",0x41,0x180,0);
    if (iVar2 < 0) goto LAB_0015c52f;
    pcStack_90 = (code *)0x15c1b8;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_90 = (code *)0x15c1ce;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015c534;
    pcStack_90 = (code *)0x15c1e2;
    uv_fs_req_cleanup(&close_req);
    pcStack_90 = (code *)0x15c205;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"test_dir",0,scandir_cb);
    if (iVar2 != 0) goto LAB_0015c539;
    pcStack_90 = (code *)0x15c21b;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_0015c53e;
    __s1 = (uv_fs_t *)0x0;
    pcStack_90 = (code *)0x15c242;
    iVar2 = uv_fs_scandir(0,&scandir_req,"test_dir",0,0);
    if (iVar2 != 2) goto LAB_0015c543;
    if (scandir_req.result != 2) goto LAB_0015c548;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0015c54d;
    pcStack_90 = (code *)0x15c276;
    iVar2 = uv_fs_scandir_next(&scandir_req,&puStack_88);
    if (iVar2 != -0xfff) {
      pcVar5 = "file1";
      unaff_R14 = &scandir_req;
      unaff_R12 = "file2";
      do {
        __s1 = (uv_fs_t *)puStack_88;
        pcVar6 = "file1";
        pcStack_90 = (code *)0x15c2a4;
        iVar2 = strcmp((char *)puStack_88,"file1");
        if (iVar2 != 0) {
          pcVar6 = "file2";
          pcStack_90 = (code *)0x15c2b3;
          iVar2 = strcmp((char *)__s1,"file2");
          if (iVar2 != 0) {
            pcStack_90 = (code *)0x15c51b;
            run_test_fs_async_dir_cold_11();
            unaff_R15 = &puStack_88;
            goto LAB_0015c51b;
          }
        }
        dent.name = (char *)(ulong)uStack_80;
        pcStack_90 = (code *)0x15c2c4;
        dent._8_8_ = pcVar6;
        assert_is_file_type(dent);
        pcStack_90 = (code *)0x15c2cf;
        iVar2 = uv_fs_scandir_next(&scandir_req,&puStack_88);
        unaff_R15 = &puStack_88;
      } while (iVar2 != -0xfff);
    }
    __s1 = &scandir_req;
    pcStack_90 = (code *)0x15c2e2;
    uv_fs_req_cleanup();
    if (scandir_req.ptr != (void *)0x0) goto LAB_0015c552;
    pcStack_90 = (code *)0x15c311;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_stat(loop,&stat_req,"test_dir",stat_cb);
    if (iVar2 != 0) goto LAB_0015c557;
    pcStack_90 = (code *)0x15c327;
    uv_run(loop,0);
    pcStack_90 = (code *)0x15c348;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_stat(loop,&stat_req,"test_dir/",stat_cb);
    if (iVar2 != 0) goto LAB_0015c55c;
    pcStack_90 = (code *)0x15c35e;
    uv_run(loop,0);
    pcStack_90 = (code *)0x15c37f;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_lstat(loop,&stat_req,"test_dir",stat_cb);
    if (iVar2 != 0) goto LAB_0015c561;
    pcStack_90 = (code *)0x15c395;
    uv_run(loop,0);
    pcStack_90 = (code *)0x15c3b6;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_lstat(loop,&stat_req,"test_dir/",stat_cb);
    if (iVar2 != 0) goto LAB_0015c566;
    pcStack_90 = (code *)0x15c3cc;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (stat_cb_count != 4) goto LAB_0015c56b;
    pcStack_90 = (code *)0x15c3fa;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_unlink(loop,&unlink_req,"test_dir/file1",unlink_cb);
    if (iVar2 != 0) goto LAB_0015c570;
    pcStack_90 = (code *)0x15c410;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (unlink_cb_count != 1) goto LAB_0015c575;
    pcStack_90 = (code *)0x15c43e;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_unlink(loop,&unlink_req,"test_dir/file2",unlink_cb);
    if (iVar2 != 0) goto LAB_0015c57a;
    pcStack_90 = (code *)0x15c454;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (unlink_cb_count != 2) goto LAB_0015c57f;
    pcStack_90 = (code *)0x15c482;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_rmdir(loop,&rmdir_req,"test_dir",rmdir_cb);
    if (iVar2 != 0) goto LAB_0015c584;
    pcStack_90 = (code *)0x15c498;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (rmdir_cb_count != 1) goto LAB_0015c589;
    pcStack_90 = (code *)0x15c4b1;
    unlink("test_dir/file1");
    pcStack_90 = (code *)0x15c4bd;
    unlink("test_dir/file2");
    pcStack_90 = (code *)0x15c4c9;
    rmdir("test_dir");
    pcStack_90 = (code *)0x15c4ce;
    pcVar5 = (char *)uv_default_loop();
    pcStack_90 = (code *)0x15c4e2;
    uv_walk(pcVar5,close_walk_cb,0);
    pcStack_90 = (code *)0x15c4ec;
    uv_run(pcVar5,0);
    pcStack_90 = (code *)0x15c4f1;
    __s1 = (uv_fs_t *)uv_default_loop();
    pcStack_90 = (code *)0x15c4f9;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      pcStack_90 = (code *)0x15c506;
      uv_library_shutdown();
      return;
    }
  }
  else {
LAB_0015c51b:
    pcStack_90 = (code *)0x15c520;
    run_test_fs_async_dir_cold_1();
LAB_0015c520:
    pcStack_90 = (code *)0x15c525;
    run_test_fs_async_dir_cold_2();
LAB_0015c525:
    pcStack_90 = (code *)0x15c52a;
    run_test_fs_async_dir_cold_3();
LAB_0015c52a:
    pcStack_90 = (code *)0x15c52f;
    run_test_fs_async_dir_cold_4();
LAB_0015c52f:
    pcStack_90 = (code *)0x15c534;
    run_test_fs_async_dir_cold_5();
LAB_0015c534:
    pcStack_90 = (code *)0x15c539;
    run_test_fs_async_dir_cold_6();
LAB_0015c539:
    pcStack_90 = (code *)0x15c53e;
    run_test_fs_async_dir_cold_7();
LAB_0015c53e:
    pcStack_90 = (code *)0x15c543;
    run_test_fs_async_dir_cold_8();
LAB_0015c543:
    pcStack_90 = (code *)0x15c548;
    run_test_fs_async_dir_cold_9();
LAB_0015c548:
    pcStack_90 = (code *)0x15c54d;
    run_test_fs_async_dir_cold_10();
LAB_0015c54d:
    pcStack_90 = (code *)0x15c552;
    run_test_fs_async_dir_cold_25();
LAB_0015c552:
    pcStack_90 = (code *)0x15c557;
    run_test_fs_async_dir_cold_12();
LAB_0015c557:
    pcStack_90 = (code *)0x15c55c;
    run_test_fs_async_dir_cold_13();
LAB_0015c55c:
    pcStack_90 = (code *)0x15c561;
    run_test_fs_async_dir_cold_14();
LAB_0015c561:
    pcStack_90 = (code *)0x15c566;
    run_test_fs_async_dir_cold_15();
LAB_0015c566:
    pcStack_90 = (code *)0x15c56b;
    run_test_fs_async_dir_cold_16();
LAB_0015c56b:
    pcStack_90 = (code *)0x15c570;
    run_test_fs_async_dir_cold_17();
LAB_0015c570:
    pcStack_90 = (code *)0x15c575;
    run_test_fs_async_dir_cold_18();
LAB_0015c575:
    pcStack_90 = (code *)0x15c57a;
    run_test_fs_async_dir_cold_19();
LAB_0015c57a:
    pcStack_90 = (code *)0x15c57f;
    run_test_fs_async_dir_cold_20();
LAB_0015c57f:
    pcStack_90 = (code *)0x15c584;
    run_test_fs_async_dir_cold_21();
LAB_0015c584:
    pcStack_90 = (code *)0x15c589;
    run_test_fs_async_dir_cold_22();
LAB_0015c589:
    pcStack_90 = (code *)0x15c58e;
    run_test_fs_async_dir_cold_23();
  }
  pcStack_90 = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (__s1 == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_0015c5ed;
    if (mkdir_req.result != 0) goto LAB_0015c5f2;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_0015c5f7;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      uv_fs_req_cleanup(&mkdir_req);
      return;
    }
  }
  else {
    pcStack_98 = (code *)0x15c5ed;
    mkdir_cb_cold_1();
LAB_0015c5ed:
    pcStack_98 = (code *)0x15c5f2;
    mkdir_cb_cold_2();
LAB_0015c5f2:
    pcStack_98 = (code *)0x15c5f7;
    mkdir_cb_cold_3();
LAB_0015c5f7:
    pcStack_98 = (code *)0x15c5fc;
    mkdir_cb_cold_5();
  }
  pcStack_98 = scandir_cb;
  mkdir_cb_cold_4();
  pcStack_b8 = pcVar5;
  pcStack_b0 = unaff_R12;
  puStack_a0 = unaff_R14;
  pcStack_98 = (code *)unaff_R15;
  if (__s1 == &scandir_req) {
    puVar7 = __s1;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_0015c708;
    if (scandir_req.result != 2) goto LAB_0015c70d;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0015c712;
    puVar7 = &scandir_req;
    iVar2 = uv_fs_scandir_next(&scandir_req,&puStack_c8);
    __s1 = (uv_fs_t *)puStack_c8;
    while (iVar2 != -0xfff) {
      pcVar5 = "file1";
      puStack_c8 = (uv_loop_t *)__s1;
      iVar2 = strcmp((char *)__s1,"file1");
      if (iVar2 != 0) {
        pcVar5 = "file2";
        iVar2 = strcmp((char *)__s1,"file2");
        if (iVar2 != 0) {
          scandir_cb_cold_4();
          goto LAB_0015c703;
        }
      }
      dent_00.name = (char *)(ulong)uStack_c0;
      dent_00._8_8_ = pcVar5;
      assert_is_file_type(dent_00);
      puVar7 = &scandir_req;
      iVar2 = uv_fs_scandir_next(&scandir_req,&puStack_c8);
      __s1 = (uv_fs_t *)puStack_c8;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_0015c717;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_0015c71c;
    puVar7 = &scandir_req;
    uv_fs_req_cleanup();
    if (scandir_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
LAB_0015c703:
    scandir_cb_cold_1();
    puVar7 = __s1;
LAB_0015c708:
    scandir_cb_cold_2();
LAB_0015c70d:
    scandir_cb_cold_3();
LAB_0015c712:
    scandir_cb_cold_8();
LAB_0015c717:
    scandir_cb_cold_7();
LAB_0015c71c:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar7 < 2) {
    return;
  }
  assert_is_file_type_cold_1();
  if (puVar7 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_0015c784;
    if (stat_req.result != 0) goto LAB_0015c789;
    if (stat_req.ptr == (void *)0x0) goto LAB_0015c78e;
    stat_cb_count = stat_cb_count + 1;
    puVar7 = &stat_req;
    uv_fs_req_cleanup();
    if (stat_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
    stat_cb_cold_1();
LAB_0015c784:
    stat_cb_cold_2();
LAB_0015c789:
    stat_cb_cold_3();
LAB_0015c78e:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar7 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_0015c7d0;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_0015c7d0:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar7 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_0015c834;
    if (rmdir_req.result != 0) goto LAB_0015c839;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return;
      }
      goto LAB_0015c843;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_0015c834:
    rmdir_cb_cold_2();
LAB_0015c839:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_0015c843:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x10009);
  return;
}

Assistant:

static void rename_cb(uv_fs_t* req) {
  ASSERT(req == &rename_req);
  ASSERT(req->fs_type == UV_FS_RENAME);
  ASSERT(req->result == 0);
  rename_cb_count++;
  uv_fs_req_cleanup(req);
}